

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeHolder::attach(CodeHolder *this,BaseEmitter *emitter)

{
  Error EVar1;
  BaseEmitter *emitter_local;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar1 = 2;
  }
  else if (emitter->_emitterType - 4 < 0xfffffffd) {
    EVar1 = 3;
  }
  else if (emitter->_code == (CodeHolder *)0x0) {
    emitter_local = emitter;
    EVar1 = ZoneVector<asmjit::BaseEmitter_*>::willGrow(&this->_emitters,&this->_allocator,1);
    if ((EVar1 == 0) && (EVar1 = (*emitter->_vptr_BaseEmitter[0x10])(emitter,this), EVar1 == 0)) {
      if (emitter->_code != this) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/codeholder.cpp"
                   ,0xea,"emitter->_code == this");
      }
      ZoneVector<asmjit::BaseEmitter_*>::appendUnsafe(&this->_emitters,&emitter_local);
      EVar1 = 0;
    }
  }
  else {
    EVar1 = (uint)(emitter->_code != this) * 3;
  }
  return EVar1;
}

Assistant:

Error CodeHolder::attach(BaseEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  // Invalid emitter, this should not be possible.
  uint32_t type = emitter->emitterType();
  if (ASMJIT_UNLIKELY(type == BaseEmitter::kTypeNone || type >= BaseEmitter::kTypeCount))
    return DebugUtils::errored(kErrorInvalidState);

  // This is suspicious, but don't fail if `emitter` is already attached
  // to this code holder. This is not error, but it's not recommended.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Reserve the space now as we cannot fail after `onAttach()` succeeded.
  ASMJIT_PROPAGATE(_emitters.willGrow(&_allocator, 1));
  ASMJIT_PROPAGATE(emitter->onAttach(this));

  // Connect CodeHolder <-> BaseEmitter.
  ASMJIT_ASSERT(emitter->_code == this);
  _emitters.appendUnsafe(emitter);

  return kErrorOk;
}